

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

Type __thiscall capnp::SchemaLoader::getType(SchemaLoader *this,Reader proto,Schema scope)

{
  Reader brand;
  Reader brand_00;
  Reader proto_00;
  Reader brand_01;
  ulong uVar1;
  undefined8 uVar2;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  ushort uVar4;
  uint index;
  short sVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint uVar9;
  Type TVar10;
  Type TVar11;
  Schema local_110;
  PointerReader local_108;
  StructReader local_e8;
  StructReader local_b8;
  StructReader local_88;
  StructReader local_58;
  
  if (proto._reader.dataSize < 0x10) {
    uVar4 = 0;
  }
  else {
    uVar4 = *proto._reader.data;
  }
  if (uVar4 < 0xe) {
    if (proto._reader.dataSize < 0x10) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)*proto._reader.data;
    }
LAB_0017d3e8:
    uVar9 = 0;
    uVar8 = 0;
    uVar6 = 0;
    TVar11.field_4.schema = (RawBrandedSchema *)0x0;
    TVar11.baseType = (short)uVar1;
    TVar11.listDepth = (char)(uVar1 >> 0x10);
    TVar11.isImplicitParam = (bool)(char)(uVar1 >> 0x18);
    TVar11.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar1 >> 0x20);
    TVar11._6_2_ = (short)(uVar1 >> 0x30);
    goto LAB_0017d3ee;
  }
  local_110.raw = scope.raw;
  switch(uVar4) {
  case 0xe:
    if (proto._reader.pointerCount == 0) {
      proto._reader.nestingLimit = 0x7fffffff;
      proto._reader.capTable = (CapTableReader *)0x0;
      proto._reader.pointers = (WirePointer *)0x0;
      proto._reader.segment = (SegmentReader *)0x0;
    }
    local_108.segment = proto._reader.segment;
    local_108.capTable = proto._reader.capTable;
    local_108.pointer = proto._reader.pointers;
    local_108.nestingLimit = proto._reader.nestingLimit;
    capnp::_::PointerReader::getStruct(&local_e8,&local_108,(word *)0x0);
    proto_00._reader.capTable = local_e8.capTable;
    proto_00._reader.segment = local_e8.segment;
    proto_00._reader.data = local_e8.data;
    proto_00._reader.pointers = local_e8.pointers;
    proto_00._reader.dataSize = local_e8.dataSize;
    proto_00._reader.pointerCount = local_e8.pointerCount;
    proto_00._reader._38_2_ = local_e8._38_2_;
    proto_00._reader.nestingLimit = local_e8.nestingLimit;
    proto_00._reader._44_4_ = local_e8._44_4_;
    TVar11 = getType(this,proto_00,local_110);
    uVar6 = TVar11._0_8_;
    uVar9 = TVar11._2_4_ + 1;
    goto LAB_0017d790;
  case 0xf:
    if (proto._reader.dataSize < 0x80) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(uint64_t *)((long)proto._reader.data + 8);
    }
    if (proto._reader.pointerCount == 0) {
      proto._reader.nestingLimit = 0x7fffffff;
      proto._reader.capTable = (CapTableReader *)0x0;
      proto._reader.pointers = (WirePointer *)0x0;
      proto._reader.segment = (SegmentReader *)0x0;
    }
    local_108.segment = proto._reader.segment;
    local_108.capTable = proto._reader.capTable;
    local_108.pointer = proto._reader.pointers;
    local_108.nestingLimit = proto._reader.nestingLimit;
    capnp::_::PointerReader::getStruct(&local_88,&local_108,(word *)0x0);
    brand_01._reader.capTable = local_88.capTable;
    brand_01._reader.segment = local_88.segment;
    brand_01._reader.data = local_88.data;
    brand_01._reader.pointers = local_88.pointers;
    brand_01._reader.dataSize = local_88.dataSize;
    brand_01._reader.pointerCount = local_88.pointerCount;
    brand_01._reader._38_2_ = local_88._38_2_;
    brand_01._reader.nestingLimit = local_88.nestingLimit;
    brand_01._reader._44_4_ = local_88._44_4_;
    local_108.segment = (SegmentReader *)get(this,uVar7,brand_01,local_110);
    aVar3 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum((Schema *)&local_108);
    uVar2 = 0xf;
    break;
  case 0x10:
    if (proto._reader.dataSize < 0x80) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(uint64_t *)((long)proto._reader.data + 8);
    }
    if (proto._reader.pointerCount == 0) {
      proto._reader.nestingLimit = 0x7fffffff;
      proto._reader.capTable = (CapTableReader *)0x0;
      proto._reader.pointers = (WirePointer *)0x0;
      proto._reader.segment = (SegmentReader *)0x0;
    }
    local_108.segment = proto._reader.segment;
    local_108.capTable = proto._reader.capTable;
    local_108.pointer = proto._reader.pointers;
    local_108.nestingLimit = proto._reader.nestingLimit;
    capnp::_::PointerReader::getStruct(&local_58,&local_108,(word *)0x0);
    brand._reader.capTable = local_58.capTable;
    brand._reader.segment = local_58.segment;
    brand._reader.data = local_58.data;
    brand._reader.pointers = local_58.pointers;
    brand._reader.dataSize = local_58.dataSize;
    brand._reader.pointerCount = local_58.pointerCount;
    brand._reader._38_2_ = local_58._38_2_;
    brand._reader.nestingLimit = local_58.nestingLimit;
    brand._reader._44_4_ = local_58._44_4_;
    local_108.segment = (SegmentReader *)get(this,uVar7,brand,local_110);
    aVar3 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&local_108);
    uVar2 = 0x10;
    break;
  case 0x11:
    if (proto._reader.dataSize < 0x80) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(uint64_t *)((long)proto._reader.data + 8);
    }
    if (proto._reader.pointerCount == 0) {
      proto._reader.nestingLimit = 0x7fffffff;
      proto._reader.capTable = (CapTableReader *)0x0;
      proto._reader.pointers = (WirePointer *)0x0;
      proto._reader.segment = (SegmentReader *)0x0;
    }
    local_108.segment = proto._reader.segment;
    local_108.capTable = proto._reader.capTable;
    local_108.pointer = proto._reader.pointers;
    local_108.nestingLimit = proto._reader.nestingLimit;
    capnp::_::PointerReader::getStruct(&local_b8,&local_108,(word *)0x0);
    brand_00._reader.capTable = local_b8.capTable;
    brand_00._reader.segment = local_b8.segment;
    brand_00._reader.data = local_b8.data;
    brand_00._reader.pointers = local_b8.pointers;
    brand_00._reader.dataSize = local_b8.dataSize;
    brand_00._reader.pointerCount = local_b8.pointerCount;
    brand_00._reader._38_2_ = local_b8._38_2_;
    brand_00._reader.nestingLimit = local_b8.nestingLimit;
    brand_00._reader._44_4_ = local_b8._44_4_;
    local_108.segment = (SegmentReader *)get(this,uVar7,brand_00,local_110);
    aVar3 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asInterface((Schema *)&local_108);
    uVar2 = 0x11;
    break;
  case 0x12:
    if (proto._reader.dataSize < 0x50) {
      sVar5 = 0;
    }
    else {
      sVar5 = *(short *)((long)proto._reader.data + 8);
    }
    uVar1 = 0x12;
    uVar9 = 0;
    if (sVar5 == 0) goto LAB_0017d3e8;
    uVar8 = 0;
    uVar6 = 0;
    TVar11 = (Type)ZEXT816(0x12);
    if (sVar5 == 2) goto LAB_0017d3ee;
    if (sVar5 != 1) goto switchD_0017d446_default;
    index = 0;
    if (proto._reader.dataSize < 0xc0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(uint64_t *)((long)proto._reader.data + 0x10);
    }
    if (0x5f < proto._reader.dataSize) {
      index = (uint)*(ushort *)((long)proto._reader.data + 10);
    }
    TVar11 = Schema::getBrandBinding(&local_110,uVar7,index);
    uVar6 = TVar11._0_8_;
    uVar9 = TVar11._2_4_;
LAB_0017d790:
    uVar6 = uVar6 & 0xffff000000000000;
    uVar8 = TVar11._0_8_;
    goto LAB_0017d3ee;
  default:
switchD_0017d446_default:
    kj::_::unreachable();
  }
  uVar9 = 0;
  TVar11.field_4.schema = aVar3.schema;
  TVar11.baseType = (short)uVar2;
  TVar11.listDepth = (char)((ulong)uVar2 >> 0x10);
  TVar11.isImplicitParam = (bool)(char)((ulong)uVar2 >> 0x18);
  TVar11.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar2 >> 0x20);
  TVar11._6_2_ = (short)((ulong)uVar2 >> 0x30);
  uVar8 = 0;
  uVar6 = 0;
LAB_0017d3ee:
  TVar10.field_4 = TVar11.field_4;
  TVar10._0_8_ = TVar11._0_8_ & 0xffff | (ulong)((uint)uVar8 & 0xff000000) |
                 (ulong)((uVar9 & 0xff) << 0x10) | uVar8 & 0xffff00000000 | uVar6;
  return TVar10;
}

Assistant:

Type SchemaLoader::getType(schema::Type::Reader proto, Schema scope) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return get(structType.getTypeId(), structType.getBrand(), scope).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return get(enumType.getTypeId(), enumType.getBrand(), scope).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return get(interfaceType.getTypeId(), interfaceType.getBrand(), scope)
          .asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(getType(proto.getList().getElementType(), scope));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return schema::Type::ANY_POINTER;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return scope.getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          // We don't support binding implicit method params here.
          return schema::Type::ANY_POINTER;
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}